

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

errr finish_parse_class(parser *p)

{
  player_class *ppVar1;
  int local_1c;
  player_class *ppStack_18;
  wchar_t num;
  player_class *c;
  parser *p_local;
  
  local_1c = 0;
  classes = (player_class *)parser_priv(p);
  for (ppStack_18 = classes; ppVar1 = classes, ppStack_18 != (player_class *)0x0;
      ppStack_18 = ppStack_18->next) {
    local_1c = local_1c + 1;
  }
  while( true ) {
    ppStack_18 = ppVar1;
    if (ppStack_18 == (player_class *)0x0) {
      parser_destroy(p);
      return 0;
    }
    if (local_1c == 0) break;
    ppStack_18->cidx = local_1c - 1;
    local_1c = local_1c + -1;
    ppVar1 = ppStack_18->next;
  }
  __assert_fail("num",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/init.c",
                0x1026,"errr finish_parse_class(struct parser *)");
}

Assistant:

static errr finish_parse_class(struct parser *p) {
	struct player_class *c;
	int num = 0;
	classes = parser_priv(p);
	for (c = classes; c; c = c->next) num++;
	for (c = classes; c; c = c->next, num--) {
		assert(num);
		c->cidx = num - 1;
	}
	parser_destroy(p);
	return 0;
}